

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_aead_ctx.cc
# Opt level: O2

bool __thiscall
bssl::SSLAEADContext::CiphertextLen
          (SSLAEADContext *this,size_t *out_len,size_t in_len,size_t extra_in_len)

{
  bool bVar1;
  ulong uVar2;
  size_t local_20;
  
  bVar1 = SuffixLen(this,&local_20,in_len,extra_in_len);
  if (bVar1) {
    uVar2 = 0;
    if ((this->field_0x26a & 1) != 0) {
      uVar2 = (ulong)this->variable_nonce_len_;
    }
    local_20 = local_20 + in_len + uVar2;
    if (local_20 < in_len || 0xfffe < local_20) {
      bVar1 = false;
      ERR_put_error(0x10,0,0x45,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_aead_ctx.cc"
                    ,0x9c);
    }
    else {
      *out_len = local_20;
      bVar1 = true;
    }
  }
  else {
    bVar1 = false;
  }
  return bVar1;
}

Assistant:

bool SSLAEADContext::CiphertextLen(size_t *out_len, const size_t in_len,
                                   const size_t extra_in_len) const {
  size_t len;
  if (!SuffixLen(&len, in_len, extra_in_len)) {
    return false;
  }
  len += ExplicitNonceLen();
  len += in_len;
  if (len < in_len || len >= 0xffff) {
    OPENSSL_PUT_ERROR(SSL, ERR_R_OVERFLOW);
    return false;
  }
  *out_len = len;
  return true;
}